

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_FunctionRedefinitionThrows_Test::
~SemanticAnalyserTest_FunctionRedefinitionThrows_Test
          (SemanticAnalyserTest_FunctionRedefinitionThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, FunctionRedefinitionThrows)
{
  std::string source = R"SRC(
  fn f(x: f32): f32 { ret 1; }
  fn f(x: f32): f32 { ret x; }

  fn main(): f32
  {
    ret 0;
  }
  )SRC";
  throwTest(source);
}